

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::removeRowSingletons(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int row;
  pointer piVar1;
  pointer piVar2;
  Result RVar3;
  size_t i;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    piVar1 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (lVar4 == (long)piVar2 - (long)piVar1 >> 2) {
      if (piVar2 != piVar1) {
        (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar1;
      }
      return kOk;
    }
    row = piVar1[lVar4];
    if ((((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[row] == '\0') &&
        ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[row] < 2)) &&
       (RVar3 = rowPresolve(this,postsolve_stack,row), RVar3 != kOk)) break;
    lVar4 = lVar4 + 1;
  }
  return RVar3;
}

Assistant:

HPresolve::Result HPresolve::removeRowSingletons(
    HighsPostsolveStack& postsolve_stack) {
  for (size_t i = 0; i != singletonRows.size(); ++i) {
    HighsInt row = singletonRows[i];
    if (rowDeleted[row] || rowsize[row] > 1) continue;
    // row presolve will delegate to rowSingleton() if the row size is 1
    // if the singleton row has become empty it will also remove the row
    HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
  }

  singletonRows.clear();

  return Result::kOk;
}